

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_tree_base(nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
                nk_collapse_states initial_state,char *hash,int len,int line)

{
  nk_window *win;
  nk_hash name;
  int iVar1;
  nk_uint *state;
  nk_table *pnVar2;
  ulong uVar3;
  
  win = ctx->current;
  if (hash == (char *)0x0) {
    len = nk_strlen(title);
    hash = title;
  }
  name = nk_murmur_hash(hash,len,line);
  pnVar2 = win->tables;
  do {
    if (pnVar2 == (nk_table *)0x0) {
      state = nk_add_value(ctx,win,name,0);
      *state = initial_state;
LAB_0011bf42:
      iVar1 = nk_tree_state_base(ctx,type,img,title,state);
      return iVar1;
    }
    uVar3 = (ulong)pnVar2->size;
    if (uVar3 != 0) {
      state = pnVar2->values;
      do {
        if (state[-0x3b] == name) {
          pnVar2->seq = win->seq;
          goto LAB_0011bf42;
        }
        state = state + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    pnVar2 = pnVar2->next;
  } while( true );
}

Assistant:

NK_INTERN int
nk_tree_base(struct nk_context *ctx, enum nk_tree_type type,
    struct nk_image *img, const char *title, enum nk_collapse_states initial_state,
    const char *hash, int len, int line)
{
    struct nk_window *win = ctx->current;
    int title_len = 0;
    nk_hash tree_hash = 0;
    nk_uint *state = 0;

    /* retrieve tree state from internal widget state tables */
    if (!hash) {
        title_len = (int)nk_strlen(title);
        tree_hash = nk_murmur_hash(title, (int)title_len, (nk_hash)line);
    } else tree_hash = nk_murmur_hash(hash, len, (nk_hash)line);
    state = nk_find_value(win, tree_hash);
    if (!state) {
        state = nk_add_value(ctx, win, tree_hash, 0);
        *state = initial_state;
    }
    return nk_tree_state_base(ctx, type, img, title, (enum nk_collapse_states*)state);
}